

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O1

void remove_object(obj *otmp)

{
  char x;
  char y;
  boolean bVar1;
  int in_ECX;
  
  x = otmp->ox;
  y = otmp->oy;
  if (otmp->where != '\x01') {
    panic("remove_object: obj not on floor");
  }
  extract_nexthere(otmp,otmp->olev->objects[x] + y);
  extract_nobj(otmp,&otmp->olev->objlist);
  if (otmp->otyp == 0x214) {
    in_ECX = 0;
    bVar1 = does_block(otmp->olev,(int)x,(int)y,(monst *)0x0);
    if (bVar1 == '\0') {
      unblock_point((int)x,(int)y);
    }
  }
  if (otmp->timed != '\0') {
    obj_timer_checks(otmp,x,y,in_ECX);
    return;
  }
  return;
}

Assistant:

void remove_object(struct obj *otmp)
{
    xchar x = otmp->ox;
    xchar y = otmp->oy;

    if (otmp->where != OBJ_FLOOR)
	panic("remove_object: obj not on floor");

    extract_nexthere(otmp, &otmp->olev->objects[x][y]);
    extract_nobj(otmp, &otmp->olev->objlist);

    /* Fix vision for boulders. */
    if (otmp->otyp == BOULDER && !does_block(otmp->olev, x, y, NULL))
	unblock_point(x, y);

    if (otmp->timed) obj_timer_checks(otmp,x,y,0);
}